

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_comparison_operations(Context *ctx,char *cmp)

{
  int mask;
  long lVar1;
  uint writemask;
  uint writemask_00;
  char *in_R8;
  char *buf;
  long lVar3;
  char *buf_00;
  int used_swiz [4];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char code [128];
  long lVar2;
  
  mask = (ctx->dest_arg).writemask;
  used_swiz[0] = 0;
  used_swiz[1] = 0;
  used_swiz[2] = 0;
  used_swiz[3] = 0;
  local_188._0_4_ = (ctx->dest_arg).writemask0;
  local_188._4_4_ = (ctx->dest_arg).writemask1;
  uStack_180._0_4_ = (ctx->dest_arg).writemask2;
  uStack_180._4_4_ = (ctx->dest_arg).writemask3;
  local_198._0_4_ = ctx->source_args[0].swizzle_x;
  local_198._4_4_ = ctx->source_args[0].swizzle_y;
  uStack_190._0_4_ = ctx->source_args[0].swizzle_z;
  uStack_190._4_4_ = ctx->source_args[0].swizzle_w;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    writemask = 1 << ((byte)lVar3 & 0x1f);
    buf = in_R8;
    if ((*(int *)((long)&local_188 + lVar3 * 4) != 0) && (used_swiz[lVar3] == 0)) {
      used_swiz[lVar3] = 1;
      lVar1 = lVar3;
      writemask_00 = writemask;
      while (lVar2 = lVar1, lVar1 = lVar2 + 1, lVar1 != 4) {
        if ((*(int *)((long)&local_188 + lVar1 * 4) != 0) &&
           (*(int *)((long)&local_198 + lVar3 * 4) == *(int *)((long)&local_198 + lVar1 * 4))) {
          writemask_00 = writemask_00 | 2 << ((byte)lVar2 & 0x1f);
          used_swiz[lVar1] = 1;
        }
      }
      buf = src0;
      make_GLSL_srcarg_string(ctx,0,writemask,buf,(size_t)in_R8);
      buf_00 = src1;
      make_GLSL_srcarg_string(ctx,1,writemask_00,buf_00,(size_t)in_R8);
      make_GLSL_srcarg_string(ctx,2,writemask_00,src2,(size_t)in_R8);
      set_dstarg_writemask(&ctx->dest_arg,writemask_00);
      make_GLSL_destarg_assign(ctx,code,0x80,"((%s %s) ? %s : %s)",buf,cmp,buf_00,src2);
      output_line(ctx,"%s",code,buf_00);
    }
    in_R8 = buf;
  }
  set_dstarg_writemask(&ctx->dest_arg,mask);
  return;
}

Assistant:

static void emit_GLSL_comparison_operations(Context *ctx, const char *cmp)
{
    int i, j;
    DestArgInfo *dst = &ctx->dest_arg;
    const SourceArgInfo *srcarg0 = &ctx->source_args[0];
    const int origmask = dst->writemask;
    int used_swiz[4] = { 0, 0, 0, 0 };
    const int writemask[4] = { dst->writemask0, dst->writemask1,
                               dst->writemask2, dst->writemask3 };
    const int src0swiz[4] = { srcarg0->swizzle_x, srcarg0->swizzle_y,
                              srcarg0->swizzle_z, srcarg0->swizzle_w };

    for (i = 0; i < 4; i++)
    {
        int mask = (1 << i);

        if (!writemask[i]) continue;
        if (used_swiz[i]) continue;

        // This is a swizzle we haven't checked yet.
        used_swiz[i] = 1;

        // see if there are any other elements swizzled to match (.yyyy)
        for (j = i + 1; j < 4; j++)
        {
            if (!writemask[j]) continue;
            if (src0swiz[i] != src0swiz[j]) continue;
            mask |= (1 << j);
            used_swiz[j] = 1;
        } // for

        // okay, (mask) should be the writemask of swizzles we like.

        //return make_GLSL_srcarg_string(ctx, idx, (1 << 0));

        char src0[64];
        char src1[64];
        char src2[64];
        make_GLSL_srcarg_string(ctx, 0, (1 << i), src0, sizeof (src0));
        make_GLSL_srcarg_string(ctx, 1, mask, src1, sizeof (src1));
        make_GLSL_srcarg_string(ctx, 2, mask, src2, sizeof (src2));

        set_dstarg_writemask(dst, mask);

        char code[128];
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "((%s %s) ? %s : %s)",
                                 src0, cmp, src1, src2);
        output_line(ctx, "%s", code);
    } // for

    set_dstarg_writemask(dst, origmask);
}